

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall
t_js_generator::t_js_generator
          (t_js_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  invalid_argument *piVar4;
  mapped_type *this_00;
  key_type_conflict local_7a [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Self local_58;
  _Base_ptr local_50;
  byte local_41;
  const_iterator cStack_40;
  bool with_ns_;
  const_iterator iter;
  string *option_string_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *parsed_options_local;
  t_program *program_local;
  t_js_generator *this_local;
  
  t_oop_generator::t_oop_generator(&this->super_t_oop_generator,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_js_generator_005649e0;
  std::__cxx11::string::string((string *)&this->ts_module_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->imports);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->module_name_2_import_path);
  std::
  unordered_map<t_program_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<t_program_*>,_std::equal_to<t_program_*>,_std::allocator<std::pair<t_program_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->include_2_import_name);
  std::__cxx11::string::string((string *)&this->thrift_package_output_directory_);
  std::__cxx11::string::string((string *)&this->js_const_type_);
  std::__cxx11::string::string((string *)&this->js_let_type_);
  std::__cxx11::string::string((string *)&this->js_var_type_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_episode_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_ts_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_ts_);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&stack0xffffffffffffffc0);
  this->gen_node_ = false;
  this->gen_jquery_ = false;
  this->gen_ts_ = false;
  this->gen_es6_ = false;
  this->gen_episode_file_ = false;
  local_41 = 0;
  local_50 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(parsed_options);
  cStack_40 = (const_iterator)local_50;
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(parsed_options);
    bVar1 = std::operator!=(&stack0xffffffffffffffc0,&local_58);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&stack0xffffffffffffffc0);
    iVar2 = std::__cxx11::string::compare((char *)ppVar3);
    if (iVar2 == 0) {
      this->gen_node_ = true;
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&stack0xffffffffffffffc0);
      iVar2 = std::__cxx11::string::compare((char *)ppVar3);
      if (iVar2 == 0) {
        this->gen_jquery_ = true;
      }
      else {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&stack0xffffffffffffffc0);
        iVar2 = std::__cxx11::string::compare((char *)ppVar3);
        if (iVar2 == 0) {
          this->gen_ts_ = true;
        }
        else {
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&stack0xffffffffffffffc0);
          iVar2 = std::__cxx11::string::compare((char *)ppVar3);
          if (iVar2 == 0) {
            local_41 = 1;
          }
          else {
            ppVar3 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->(&stack0xffffffffffffffc0);
            iVar2 = std::__cxx11::string::compare((char *)ppVar3);
            if (iVar2 == 0) {
              this->gen_es6_ = true;
            }
            else {
              ppVar3 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator->(&stack0xffffffffffffffc0);
              iVar2 = std::__cxx11::string::compare((char *)ppVar3);
              if (iVar2 == 0) {
                ppVar3 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator->(&stack0xffffffffffffffc0);
                parse_imports(this,program,&ppVar3->second);
              }
              else {
                ppVar3 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator->(&stack0xffffffffffffffc0);
                iVar2 = std::__cxx11::string::compare((char *)ppVar3);
                if (iVar2 != 0) {
                  local_7a[1] = 1;
                  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  ppVar3 = std::
                           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator->(&stack0xffffffffffffffc0);
                  std::operator+(&local_78,"unknown option js:",&ppVar3->first);
                  std::invalid_argument::invalid_argument(piVar4,(string *)&local_78);
                  local_7a[1] = 0;
                  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                ppVar3 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator->(&stack0xffffffffffffffc0);
                parse_thrift_package_output_directory(this,&ppVar3->second);
              }
            }
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&stack0xffffffffffffffc0);
  }
  if (((this->gen_es6_ & 1U) != 0) && ((this->gen_jquery_ & 1U) != 0)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"invalid switch: [-gen js:es6,jquery] options not compatible");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((this->gen_node_ & 1U) != 0) && ((this->gen_jquery_ & 1U) != 0)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "invalid switch: [-gen js:node,jquery] options not compatible, try: [-gen js:node -gen js:jquery]"
              );
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((this->gen_node_ & 1U) == 0) && ((local_41 & 1) != 0)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"invalid switch: [-gen js:with_ns] is only valid when using node.js");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::operator=((string *)&this->js_const_type_,"var ");
  std::__cxx11::string::operator=((string *)&this->js_let_type_,"var ");
  std::__cxx11::string::operator=((string *)&this->js_var_type_,"var ");
  if ((this->gen_es6_ & 1U) != 0) {
    std::__cxx11::string::operator=((string *)&this->js_const_type_,"const ");
    std::__cxx11::string::operator=((string *)&this->js_let_type_,"let ");
  }
  if ((this->gen_node_ & 1U) == 0) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_t_oop_generator).super_t_generator.out_dir_base_,"gen-js");
    this->no_ns_ = false;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&(this->super_t_oop_generator).super_t_generator.out_dir_base_,"gen-nodejs"
              );
    this->no_ns_ = (bool)((local_41 ^ 0xff) & 1);
  }
  local_7a[0] = '\'';
  this_00 = std::
            map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&(this->super_t_oop_generator).super_t_generator.escape_,local_7a);
  std::__cxx11::string::operator=((string *)this_00,"\\\'");
  return;
}

Assistant:

t_js_generator(t_program* program,
                 const std::map<std::string, std::string>& parsed_options,
                 const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    gen_node_ = false;
    gen_jquery_ = false;
    gen_ts_ = false;
    gen_es6_ = false;
    gen_episode_file_ = false;

    bool with_ns_ = false;

    for (iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("node") == 0) {
        gen_node_ = true;
      } else if( iter->first.compare("jquery") == 0) {
        gen_jquery_ = true;
      } else if( iter->first.compare("ts") == 0) {
        gen_ts_ = true;
      } else if( iter->first.compare("with_ns") == 0) {
        with_ns_ = true;
      } else if( iter->first.compare("es6") == 0) {
        gen_es6_ = true;
      } else if( iter->first.compare("imports") == 0) {
        parse_imports(program, iter->second);
      } else if (iter->first.compare("thrift_package_output_directory") == 0) {
        parse_thrift_package_output_directory(iter->second);
      } else {
        throw std::invalid_argument("unknown option js:" + iter->first);
      }
    }

    if (gen_es6_ && gen_jquery_) {
      throw std::invalid_argument("invalid switch: [-gen js:es6,jquery] options not compatible");
    }

    if (gen_node_ && gen_jquery_) {
      throw std::invalid_argument("invalid switch: [-gen js:node,jquery] options not compatible, try: [-gen js:node -gen "
            "js:jquery]");
    }

    if (!gen_node_ && with_ns_) {
      throw std::invalid_argument("invalid switch: [-gen js:with_ns] is only valid when using node.js");
    }

    // Depending on the processing flags, we will update these to be ES6 compatible
    js_const_type_ = "var ";
    js_let_type_ = "var ";
    js_var_type_ = "var ";
    if (gen_es6_) {
      js_const_type_ = "const ";
      js_let_type_ = "let ";
    }

    if (gen_node_) {
      out_dir_base_ = "gen-nodejs";
      no_ns_ = !with_ns_;
    } else {
      out_dir_base_ = "gen-js";
      no_ns_ = false;
    }

    escape_['\''] = "\\'";
  }